

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void tlstran_pipe_send_start(tlstran_pipe *p)

{
  nni_aio *aio;
  nni_msg *m;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  uint nio;
  undefined1 local_68 [8];
  nni_iov iov [3];
  
  aio = (nni_aio *)nni_list_first(&p->sendq);
  if (aio != (nni_aio *)0x0) {
    m = nni_aio_get_msg(aio);
    sVar1 = nni_msg_len(m);
    sVar2 = nni_msg_header_len(m);
    uVar3 = sVar2 + sVar1;
    local_68 = (undefined1  [8])p->txlen;
    *(ulong *)p->txlen =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    iov[0].iov_buf = (void *)0x8;
    sVar1 = nni_msg_header_len(m);
    if (sVar1 == 0) {
      nio = 1;
    }
    else {
      iov[0].iov_len = (size_t)nni_msg_header(m);
      iov[1].iov_buf = (void *)nni_msg_header_len(m);
      nio = 2;
    }
    sVar1 = nni_msg_len(m);
    if (sVar1 != 0) {
      pvVar4 = nni_msg_body(m);
      *(void **)((long)iov + ((ulong)(nio << 4) - 8)) = pvVar4;
      sVar1 = nni_msg_len(m);
      *(size_t *)((long)&iov[0].iov_buf + (ulong)(nio << 4)) = sVar1;
      nio = nio + 1;
    }
    nni_aio_set_iov(&p->txaio,nio,(nni_iov *)local_68);
    nng_stream_send(p->tls,&p->txaio);
  }
  return;
}

Assistant:

static void
tlstran_pipe_send_start(tlstran_pipe *p)
{
	nni_aio *txaio;
	nni_aio *aio;
	nni_msg *msg;
	int      niov;
	nni_iov  iov[3];
	uint64_t len;

	if ((aio = nni_list_first(&p->sendq)) == NULL) {
		return;
	}

	msg = nni_aio_get_msg(aio);
	len = nni_msg_len(msg) + nni_msg_header_len(msg);

	NNI_PUT64(p->txlen, len);

	txaio             = &p->txaio;
	niov              = 0;
	iov[niov].iov_buf = p->txlen;
	iov[niov].iov_len = sizeof(p->txlen);
	niov++;
	if (nni_msg_header_len(msg) > 0) {
		iov[niov].iov_buf = nni_msg_header(msg);
		iov[niov].iov_len = nni_msg_header_len(msg);
		niov++;
	}
	if (nni_msg_len(msg) > 0) {
		iov[niov].iov_buf = nni_msg_body(msg);
		iov[niov].iov_len = nni_msg_len(msg);
		niov++;
	}

	nni_aio_set_iov(txaio, niov, iov);
	nng_stream_send(p->tls, txaio);
}